

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall efsw::String::insert(String *this,size_t pos1,char *s)

{
  long lVar1;
  size_type __n2;
  String tmp;
  String local_38;
  
  String(&local_38,s);
  __n2 = 0xffffffffffffffff;
  do {
    lVar1 = __n2 + 1;
    __n2 = __n2 + 1;
  } while (local_38.mString._M_dataplus._M_p[lVar1] != L'\0');
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,pos1,0,local_38.mString._M_dataplus._M_p,__n2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return this;
}

Assistant:

String& String::insert( size_t pos1, const char* s ) {
	String tmp( s );

	mString.insert( pos1, tmp.data() );

	return *this;
}